

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O0

void __thiscall Nes_Dmc::reset(Nes_Dmc *this)

{
  Nes_Osc *in_RDI;
  
  in_RDI[1].regs[0] = '\0';
  in_RDI[1].regs[1] = '\0';
  in_RDI[1].regs[2] = '\0';
  in_RDI[1].regs[3] = '\0';
  in_RDI[1].last_amp = 0;
  *(undefined4 *)&in_RDI[1].output = 0;
  *(undefined4 *)((long)&in_RDI[1].output + 4) = 1;
  in_RDI[1].length_counter = 0;
  *(undefined1 *)&in_RDI[1].delay = 0;
  *(undefined1 *)((long)&in_RDI[1].delay + 1) = 1;
  *(undefined4 *)&in_RDI[1].field_0x1c = 0x40000000;
  in_RDI[2].regs[1] = '\0';
  in_RDI[2].regs[0] = '\0';
  Nes_Osc::reset(in_RDI);
  in_RDI[1].reg_written[0] = true;
  in_RDI[1].reg_written[1] = true;
  in_RDI[1].reg_written[2] = false;
  in_RDI[1].reg_written[3] = false;
  return;
}

Assistant:

void Nes_Dmc::reset()
{
	address = 0;
	dac = 0;
	buf = 0;
	bits_remain = 1;
	bits = 0;
	buf_full = false;
	silence = true;
	next_irq = Nes_Apu::no_irq;
	irq_flag = false;
	irq_enabled = false;
	
	Nes_Osc::reset();
	period = 0x1AC;
}